

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall SummedArea_Randoms_Test::TestBody(SummedArea_Randoms_Test *this)

{
  Allocator alloc;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  int __x;
  float fVar9;
  float fVar10;
  double *args_1;
  Bounds2iIterator BVar11;
  Bounds2iIterator BVar12;
  AssertionResult gtest_ar;
  double s;
  Point2i p;
  Bounds2iIterator __end3;
  Bounds2iIterator __begin3;
  Bounds2i *__range3;
  double ref;
  Bounds2f bf;
  Bounds2i bi;
  int i;
  SummedAreaTable sat;
  int x;
  int y;
  Array2D<float> v;
  array<int,_2UL> d;
  array<int,_2UL> *__end1;
  array<int,_2UL> *__begin1;
  array<int,_2UL> (*__range1) [6];
  RNG rng;
  array<int,_2UL> dims [6];
  float in_stack_fffffffffffffd48;
  float in_stack_fffffffffffffd4c;
  Array2D<float> *in_stack_fffffffffffffd50;
  Bounds2iIterator *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  int in_stack_fffffffffffffd70;
  Float in_stack_fffffffffffffd74;
  int in_stack_fffffffffffffd78;
  Type in_stack_fffffffffffffd7c;
  allocator_type in_stack_fffffffffffffd80;
  Tuple2<pbrt::Point2,_int> local_278;
  undefined4 in_stack_fffffffffffffdc8;
  float in_stack_fffffffffffffe14;
  float *in_stack_fffffffffffffe18;
  string local_1b8 [44];
  undefined4 local_18c;
  double *local_188;
  AssertionResult local_180;
  double local_170;
  Bounds2iIterator local_168;
  Tuple2<pbrt::Point2,_int> local_158;
  Tuple2<pbrt::Point2,_int> local_150;
  Bounds2iIterator local_148;
  Bounds2iIterator local_138;
  undefined1 *local_128;
  double local_120;
  undefined1 local_e4 [8];
  int local_dc;
  int local_d8;
  int local_d4;
  undefined1 local_c8 [32];
  int local_a8;
  int local_94;
  Array2D<float> local_88;
  undefined8 local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  RNG local_48;
  undefined8 local_38 [6];
  undefined8 local_8;
  
  memcpy(local_38,&DAT_00b388f0,0x30);
  pbrt::RNG::RNG(&local_48);
  local_60 = &local_8;
  local_58 = local_38;
  local_50 = local_58;
  for (; local_58 != local_60; local_58 = local_58 + 1) {
    local_68 = *local_58;
    std::array<int,_2UL>::operator[]
              ((array<int,_2UL> *)in_stack_fffffffffffffd50,
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    std::array<int,_2UL>::operator[]
              ((array<int,_2UL> *)in_stack_fffffffffffffd50,
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffd50);
    pbrt::Array2D<float>::Array2D
              ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               (int)in_stack_fffffffffffffd74,in_stack_fffffffffffffd70,in_stack_fffffffffffffd80);
    local_94 = 0;
    while( true ) {
      iVar3 = local_94;
      iVar2 = pbrt::Array2D<float>::ySize(&local_88);
      if (iVar2 <= iVar3) break;
      local_a8 = 0;
      while( true ) {
        iVar3 = local_a8;
        iVar2 = pbrt::Array2D<float>::xSize(&local_88);
        if (iVar2 <= iVar3) break;
        iVar3 = pbrt::RNG::Uniform<int>
                          ((RNG *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                           (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),in_stack_fffffffffffffd50
                          );
        in_stack_fffffffffffffe14 = (float)iVar3;
        in_stack_fffffffffffffe18 =
             pbrt::Array2D<float>::operator()
                       ((Array2D<float> *)
                        CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                        (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                        (int)in_stack_fffffffffffffd58);
        *in_stack_fffffffffffffe18 = in_stack_fffffffffffffe14;
        local_a8 = local_a8 + 1;
      }
      local_94 = local_94 + 1;
    }
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffd50);
    alloc.memoryResource._7_1_ = in_stack_fffffffffffffd67;
    alloc.memoryResource._0_7_ = in_stack_fffffffffffffd60;
    pbrt::SummedAreaTable::SummedAreaTable
              ((SummedAreaTable *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,alloc);
    for (local_d4 = 0; local_d4 < 100; local_d4 = local_d4 + 1) {
      iVar3 = pbrt::Array2D<float>::xSize(&local_88);
      iVar2 = pbrt::RNG::Uniform<int>
                        ((RNG *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),in_stack_fffffffffffffd50);
      iVar4 = pbrt::Array2D<float>::ySize(&local_88);
      iVar5 = pbrt::RNG::Uniform<int>
                        ((RNG *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),in_stack_fffffffffffffd50);
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffffd50,(int)in_stack_fffffffffffffd4c,
                 (int)in_stack_fffffffffffffd48);
      iVar6 = pbrt::Array2D<float>::xSize(&local_88);
      pbrt::RNG::Uniform<int>
                ((RNG *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                 (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),in_stack_fffffffffffffd50);
      pbrt::Array2D<float>::ySize(&local_88);
      pbrt::RNG::Uniform<int>
                ((RNG *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                 (int)((ulong)in_stack_fffffffffffffd58 >> 0x20),in_stack_fffffffffffffd50);
      pbrt::Point2<int>::Point2
                ((Point2<int> *)in_stack_fffffffffffffd50,(int)in_stack_fffffffffffffd4c,
                 (int)in_stack_fffffffffffffd48);
      pbrt::Bounds2<int>::Bounds2
                ((Bounds2<int> *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                 &in_stack_fffffffffffffd58->p,(Point2<int> *)in_stack_fffffffffffffd50);
      pbrt::Array2D<float>::xSize(&local_88);
      pbrt::Array2D<float>::ySize(&local_88);
      pbrt::Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                 in_stack_fffffffffffffd48);
      fVar9 = (float)local_dc;
      iVar7 = pbrt::Array2D<float>::xSize(&local_88);
      fVar9 = fVar9 / (float)iVar7;
      fVar10 = (float)local_d8;
      iVar7 = pbrt::Array2D<float>::ySize(&local_88);
      pbrt::Point2<float>::Point2
                ((Point2<float> *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                 in_stack_fffffffffffffd48);
      pbrt::Bounds2<float>::Bounds2
                ((Bounds2<float> *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                 (Point2<float> *)in_stack_fffffffffffffd58,
                 (Point2<float> *)in_stack_fffffffffffffd50);
      local_120 = 0.0;
      local_128 = local_e4;
      BVar11 = pbrt::begin((Bounds2i *)0x64be59);
      local_138 = BVar11;
      BVar12 = pbrt::end(&in_stack_fffffffffffffd50->extent);
      BVar11.bounds = (Bounds2i *)in_stack_fffffffffffffd80.memoryResource;
      BVar11.p.super_Tuple2<pbrt::Point2,_int> = local_278;
      local_148 = BVar12;
      while( true ) {
        in_stack_fffffffffffffd80.memoryResource = (memory_resource *)BVar11.bounds;
        local_278 = (Tuple2<pbrt::Point2,_int>)BVar11.p.super_Tuple2<pbrt::Point2,_int>;
        bVar1 = pbrt::Bounds2iIterator::operator!=
                          ((Bounds2iIterator *)
                           CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),
                           in_stack_fffffffffffffd58);
        if (!bVar1) break;
        local_158 = (Tuple2<pbrt::Point2,_int>)pbrt::Bounds2iIterator::operator*(&local_138);
        local_150 = local_158;
        pfVar8 = pbrt::Array2D<float>::operator[](&local_88,(Point2i)local_158);
        local_120 = (double)*pfVar8 + local_120;
        BVar11 = pbrt::Bounds2iIterator::operator++
                           ((Bounds2iIterator *)
                            CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        local_168 = BVar11;
      }
      in_stack_fffffffffffffd7c = pbrt::Array2D<float>::xSize(&local_88);
      in_stack_fffffffffffffd78 = pbrt::Array2D<float>::ySize(&local_88);
      local_120 = local_120 / (double)(int)(in_stack_fffffffffffffd7c * in_stack_fffffffffffffd78);
      __x = (int)local_c8;
      in_stack_fffffffffffffd74 =
           pbrt::SummedAreaTable::Sum
                     ((SummedAreaTable *)in_stack_fffffffffffffd80.memoryResource,
                      (Bounds2f *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
      local_170 = (double)in_stack_fffffffffffffd74;
      if ((local_120 != local_170) || (NAN(local_120) || NAN(local_170))) {
        args_1 = (double *)((local_120 - local_170) / local_120);
        std::abs(__x);
        local_18c = 0x3a83126f;
        local_188 = args_1;
        testing::internal::CmpHelperLT<double,float>
                  ((char *)in_stack_fffffffffffffe18,
                   (char *)CONCAT44(in_stack_fffffffffffffe14,iVar3),(double *)CONCAT44(iVar2,iVar4)
                   ,(float *)CONCAT44(iVar5,iVar6));
        in_stack_fffffffffffffd67 = testing::AssertionResult::operator_cast_to_bool(&local_180);
        if (!(bool)in_stack_fffffffffffffd67) {
          testing::Message::Message((Message *)in_stack_fffffffffffffd80.memoryResource);
          pbrt::StringPrintf<double&,double&>
                    ((char *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                     (double *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),args_1)
          ;
          iVar3 = (int)((ulong)args_1 >> 0x20);
          in_stack_fffffffffffffd58 =
               (Bounds2iIterator *)
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffd50,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
          in_stack_fffffffffffffd50 =
               (Array2D<float> *)
               testing::AssertionResult::failure_message((AssertionResult *)0x64c134);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffd80.memoryResource,
                     in_stack_fffffffffffffd7c,
                     (char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),iVar3,
                     (char *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)CONCAT44(iVar7,fVar10),
                     (Message *)CONCAT44(fVar9,in_stack_fffffffffffffdc8));
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
          std::__cxx11::string::~string(local_1b8);
          testing::Message::~Message((Message *)0x64c19b);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x64c213);
      }
    }
    pbrt::SummedAreaTable::~SummedAreaTable((SummedAreaTable *)0x64c249);
    pbrt::Array2D<float>::~Array2D
              ((Array2D<float> *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  }
  return;
}

Assistant:

TEST(SummedArea, Randoms) {
    std::array<int, 2> dims[] = {{1, 6}, {6, 1}, {12, 19}, {16, 16}, {100, 300}, {49, 2}};
    RNG rng;
    for (const auto d : dims) {
        Array2D<Float> v(d[0], d[1]);

        for (int y = 0; y < v.ySize(); ++y)
            for (int x = 0; x < v.xSize(); ++x)
                v(x, y) = rng.Uniform<int>(32);

        SummedAreaTable sat(v);

        for (int i = 0; i < 100; ++i) {
            Bounds2i bi({rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())},
                        {rng.Uniform<int>(v.xSize()), rng.Uniform<int>(v.ySize())});
            Bounds2f bf(Point2f(Float(bi.pMin.x) / Float(v.xSize()),
                                Float(bi.pMin.y) / Float(v.ySize())),
                        Point2f(Float(bi.pMax.x) / Float(v.xSize()),
                                Float(bi.pMax.y) / Float(v.ySize())));
            double ref = 0;

            for (Point2i p : bi)
                ref += v[p];
            ref /= v.xSize() * v.ySize();

            double s = sat.Sum(bf);
            if (ref != s)
                EXPECT_LT(std::abs((ref - s) / ref), 1e-3f)
                    << StringPrintf("ref %f s %f", ref, s);
        }
    }
}